

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_280db::Environment::RandomFuse(Environment *this,BitGen *gen)

{
  bool bVar1;
  element_type *peVar2;
  upb_Arena *a1;
  upb_Arena *a2;
  char *message;
  char *in_R9;
  string local_90;
  AssertHelper local_70;
  Message local_68;
  bool local_59;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  shared_ptr<const_upb::Arena> b;
  shared_ptr<const_upb::Arena> a;
  BitGen *gen_local;
  Environment *this_local;
  
  RandomNonNullArena((Environment *)
                     &b.super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ,(BitGen *)this);
  RandomNonNullArena((Environment *)&stack0xffffffffffffffc8,(BitGen *)this);
  peVar2 = std::__shared_ptr_access<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&b.super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  a1 = upb::Arena::ptr(peVar2);
  peVar2 = std::__shared_ptr_access<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&stack0xffffffffffffffc8);
  a2 = upb::Arena::ptr(peVar2);
  local_59 = upb_Arena_Fuse(a1,a2);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_58,&local_59,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_58,
               (AssertionResult *)"upb_Arena_Fuse(a->ptr(), b->ptr())","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x15d,message);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  std::shared_ptr<const_upb::Arena>::~shared_ptr
            ((shared_ptr<const_upb::Arena> *)&stack0xffffffffffffffc8);
  std::shared_ptr<const_upb::Arena>::~shared_ptr
            ((shared_ptr<const_upb::Arena> *)
             &b.super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void RandomFuse(absl::BitGen& gen) {
    std::shared_ptr<const upb::Arena> a = RandomNonNullArena(gen);
    std::shared_ptr<const upb::Arena> b = RandomNonNullArena(gen);
    EXPECT_TRUE(upb_Arena_Fuse(a->ptr(), b->ptr()));
  }